

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

void expand_cache_path(char *path,char *dir,char *fn)

{
  char *in_RAX;
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  char *__dest;
  char *endp;
  char *local_38;
  
  local_38 = in_RAX;
  pcVar1 = strchr(dir,0x25);
  do {
    if (pcVar1 == (char *)0x0) {
      strcpy(path,dir);
      sVar2 = strlen(dir);
      pcVar1 = path + sVar2;
      if ((*fn != '\0') && (pcVar1[-1] != '/')) {
        *pcVar1 = '/';
        pcVar1 = pcVar1 + 1;
      }
      strcpy(pcVar1,fn);
      return;
    }
    strncpy(path,dir,(long)pcVar1 - (long)dir);
    __dest = path + ((long)pcVar1 - (long)dir);
    if (pcVar1[1] == 's') {
      strcpy(__dest,fn);
      sVar2 = strlen(fn);
      path = __dest + sVar2;
      fn = fn + sVar2;
LAB_00124bc0:
      dir = pcVar1 + 2;
    }
    else {
      if ((9 < (byte)(pcVar1[1] - 0x30U)) ||
         (uVar3 = strtol(pcVar1 + 1,&local_38,10), *local_38 != 's')) {
        *__dest = '%';
        __dest[1] = pcVar1[1];
        path = __dest + 2;
        goto LAB_00124bc0;
      }
      sVar2 = strlen(fn);
      if (uVar3 < sVar2) {
        sVar2 = uVar3;
      }
      strncpy(__dest,fn,sVar2);
      path = __dest + sVar2;
      fn = fn + sVar2;
      __dest[sVar2] = '\0';
      dir = local_38 + 1;
    }
    pcVar1 = strchr(dir,0x25);
  } while( true );
}

Assistant:

void expand_cache_path(char *path, char *dir, char *fn) {
    char *cp;

    while ((cp = strchr(dir, '%'))) {
	strncpy(path, dir, cp-dir);
	path += cp-dir;

	if (*++cp == 's') {
	    strcpy(path, fn);
	    path += strlen(fn);
	    fn += strlen(fn);
	    cp++;
	} else if (*cp >= '0' && *cp <= '9') {
	    char *endp;
	    long l;

	    l = strtol(cp, &endp, 10);
	    l = MIN(l, strlen(fn));
	    if (*endp == 's') {
		strncpy(path, fn, l);
		path += l;
		fn += l;
		*path = 0;
		cp = endp+1;
	    } else {
		*path++ = '%';
		*path++ = *cp++;
	    }
	} else {
	    *path++ = '%';
	    *path++ = *cp++;
	}
	dir = cp;
    }
    strcpy(path, dir);
    path += strlen(dir);
    if (*fn && path[-1] != '/')
	*path++ = '/';
    strcpy(path, fn);
}